

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_execution_limitations.cpp
# Opt level: O0

spv_result_t spvtools::val::ValidateExecutionLimitations(ValidationState_t *_,Instruction *inst)

{
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *this;
  Function *this_00;
  Instruction *pIVar1;
  bool bVar2;
  Op OVar3;
  uint32_t uVar4;
  DiagnosticStream *pDVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  reference puVar6;
  reference pEVar7;
  Function *entry_point;
  string local_8a0;
  string local_880;
  DiagnosticStream local_860;
  undefined1 local_688 [8];
  string reason;
  string local_660;
  string local_640;
  DiagnosticStream local_620;
  undefined1 local_448 [8];
  string reason_1;
  iterator iStack_420;
  ExecutionModel model;
  iterator __end4;
  iterator __begin4;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *__range4;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *local_230;
  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
  *models;
  const_iterator cStack_220;
  uint32_t entry_id;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  DiagnosticStream local_200;
  Function *local_28;
  Function *func;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  func = (Function *)inst;
  inst_local = (Instruction *)_;
  OVar3 = Instruction::opcode(inst);
  pIVar1 = inst_local;
  if (OVar3 == OpFunction) {
    uVar4 = Instruction::id((Instruction *)func);
    local_28 = ValidationState_t::function((ValidationState_t *)pIVar1,uVar4);
    pIVar1 = inst_local;
    if (local_28 == (Function *)0x0) {
      ValidationState_t::diag
                (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INTERNAL,(Instruction *)func);
      pDVar5 = DiagnosticStream::operator<<
                         (&local_200,(char (*) [37])"Internal error: missing function id ");
      __range2._4_4_ = Instruction::id((Instruction *)func);
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(uint *)((long)&__range2 + 4));
      pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [2])0x565143);
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
      DiagnosticStream::~DiagnosticStream(&local_200);
    }
    else {
      uVar4 = Instruction::id((Instruction *)func);
      this_01 = ValidationState_t::FunctionEntryPoints((ValidationState_t *)pIVar1,uVar4);
      __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(this_01);
      cStack_220 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(this_01);
      while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffde0), bVar2) {
        puVar6 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2);
        models._4_4_ = *puVar6;
        local_230 = ValidationState_t::GetExecutionModels
                              ((ValidationState_t *)inst_local,models._4_4_);
        if (local_230 !=
            (set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
             *)0x0) {
          bVar2 = std::
                  set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                  ::empty(local_230);
          this = local_230;
          if (bVar2) {
            ValidationState_t::diag
                      ((DiagnosticStream *)&__range4,(ValidationState_t *)inst_local,
                       SPV_ERROR_INTERNAL,(Instruction *)func);
            pDVar5 = DiagnosticStream::operator<<
                               ((DiagnosticStream *)&__range4,
                                (char (*) [56])
                                "Internal error: empty execution models for function id ");
            pDVar5 = DiagnosticStream::operator<<(pDVar5,(uint *)((long)&models + 4));
            pDVar5 = DiagnosticStream::operator<<(pDVar5,(char (*) [2])0x565143);
            __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&__range4);
            return __local._4_4_;
          }
          __end4 = std::
                   set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                   ::begin(local_230);
          iStack_420 = std::
                       set<spv::ExecutionModel,_std::less<spv::ExecutionModel>,_std::allocator<spv::ExecutionModel>_>
                       ::end(this);
          while (bVar2 = std::operator!=(&__end4,&stack0xfffffffffffffbe0), bVar2) {
            pEVar7 = std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator*(&__end4);
            reason_1.field_2._12_4_ = *pEVar7;
            std::__cxx11::string::string((string *)local_448);
            bVar2 = Function::IsCompatibleWithExecutionModel
                              (local_28,reason_1.field_2._12_4_,(string *)local_448);
            if (!bVar2) {
              ValidationState_t::diag
                        (&local_620,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                         (Instruction *)func);
              pDVar5 = DiagnosticStream::operator<<
                                 (&local_620,(char (*) [31])"OpEntryPoint Entry Point <id> ");
              ValidationState_t::getIdName_abi_cxx11_
                        (&local_640,(ValidationState_t *)inst_local,models._4_4_);
              pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_640);
              pDVar5 = DiagnosticStream::operator<<
                                 (pDVar5,(char (*) [36])"s callgraph contains function <id> ");
              pIVar1 = inst_local;
              uVar4 = Instruction::id((Instruction *)func);
              ValidationState_t::getIdName_abi_cxx11_(&local_660,(ValidationState_t *)pIVar1,uVar4);
              pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_660);
              pDVar5 = DiagnosticStream::operator<<
                                 (pDVar5,(char (*) [58])
                                         ", which cannot be used with the current execution model:\n"
                                 );
              pDVar5 = DiagnosticStream::operator<<
                                 (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_448);
              __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
              std::__cxx11::string::~string((string *)&local_660);
              std::__cxx11::string::~string((string *)&local_640);
              DiagnosticStream::~DiagnosticStream(&local_620);
            }
            reason.field_2._13_3_ = 0;
            reason.field_2._M_local_buf[0xc] = !bVar2;
            std::__cxx11::string::~string((string *)local_448);
            if (reason.field_2._12_4_ != 0) {
              return __local._4_4_;
            }
            std::_Rb_tree_const_iterator<spv::ExecutionModel>::operator++(&__end4);
          }
        }
        std::__cxx11::string::string((string *)local_688);
        pIVar1 = inst_local;
        this_00 = local_28;
        entry_point = ValidationState_t::function((ValidationState_t *)inst_local,models._4_4_);
        bVar2 = Function::CheckLimitations
                          (this_00,(ValidationState_t *)pIVar1,entry_point,(string *)local_688);
        if (!bVar2) {
          ValidationState_t::diag
                    (&local_860,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,
                     (Instruction *)func);
          pDVar5 = DiagnosticStream::operator<<
                             (&local_860,(char (*) [31])"OpEntryPoint Entry Point <id> ");
          ValidationState_t::getIdName_abi_cxx11_
                    (&local_880,(ValidationState_t *)inst_local,models._4_4_);
          pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_880);
          pDVar5 = DiagnosticStream::operator<<
                             (pDVar5,(char (*) [36])"s callgraph contains function <id> ");
          pIVar1 = inst_local;
          uVar4 = Instruction::id((Instruction *)func);
          ValidationState_t::getIdName_abi_cxx11_(&local_8a0,(ValidationState_t *)pIVar1,uVar4);
          pDVar5 = DiagnosticStream::operator<<(pDVar5,&local_8a0);
          pDVar5 = DiagnosticStream::operator<<
                             (pDVar5,(char (*) [58])
                                     ", which cannot be used with the current execution modes:\n");
          pDVar5 = DiagnosticStream::operator<<
                             (pDVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_688);
          __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar5);
          std::__cxx11::string::~string((string *)&local_8a0);
          std::__cxx11::string::~string((string *)&local_880);
          DiagnosticStream::~DiagnosticStream(&local_860);
        }
        reason.field_2._13_3_ = 0;
        reason.field_2._M_local_buf[0xc] = !bVar2;
        std::__cxx11::string::~string((string *)local_688);
        if (reason.field_2._12_4_ != 0) {
          return __local._4_4_;
        }
        __gnu_cxx::
        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2);
      }
      __local._4_4_ = SPV_SUCCESS;
    }
  }
  else {
    __local._4_4_ = SPV_SUCCESS;
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateExecutionLimitations(ValidationState_t& _,
                                          const Instruction* inst) {
  if (inst->opcode() != spv::Op::OpFunction) {
    return SPV_SUCCESS;
  }

  const auto func = _.function(inst->id());
  if (!func) {
    return _.diag(SPV_ERROR_INTERNAL, inst)
           << "Internal error: missing function id " << inst->id() << ".";
  }

  for (uint32_t entry_id : _.FunctionEntryPoints(inst->id())) {
    const auto* models = _.GetExecutionModels(entry_id);
    if (models) {
      if (models->empty()) {
        return _.diag(SPV_ERROR_INTERNAL, inst)
               << "Internal error: empty execution models for function id "
               << entry_id << ".";
      }
      for (const auto model : *models) {
        std::string reason;
        if (!func->IsCompatibleWithExecutionModel(model, &reason)) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "OpEntryPoint Entry Point <id> " << _.getIdName(entry_id)
                 << "s callgraph contains function <id> "
                 << _.getIdName(inst->id())
                 << ", which cannot be used with the current execution "
                    "model:\n"
                 << reason;
        }
      }
    }

    std::string reason;
    if (!func->CheckLimitations(_, _.function(entry_id), &reason)) {
      return _.diag(SPV_ERROR_INVALID_ID, inst)
             << "OpEntryPoint Entry Point <id> " << _.getIdName(entry_id)
             << "s callgraph contains function <id> " << _.getIdName(inst->id())
             << ", which cannot be used with the current execution "
                "modes:\n"
             << reason;
    }
  }
  return SPV_SUCCESS;
}